

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureTheFlag.cpp
# Opt level: O0

Vec3 __thiscall anon_unknown.dwarf_339b0::CtfSeeker::XXXsteerToEvadeAllDefenders(CtfSeeker *this)

{
  Vec3 VVar1;
  AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *in_RDI;
  float fVar2;
  undefined8 extraout_XMM0_Qa;
  SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
  *extraout_XMM0_Qa_00;
  float fVar3;
  Vec3 VVar4;
  Vec3 adjustedFlee;
  float forwardWeight;
  float distanceWeight;
  float behindThreshold;
  float eForwardDistance;
  Vec3 flee;
  Vec3 eFuture;
  float timeEstimate;
  float eDistance;
  Vec3 eOffset;
  CtfEnemy *e;
  int i;
  Vec3 evade;
  undefined4 in_stack_fffffffffffffe78;
  Vec3 *in_stack_fffffffffffffe88;
  float local_150;
  undefined4 in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  float in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  float in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
  *in_stack_ffffffffffffff20;
  Vec3 local_a0;
  float local_90;
  float local_8c;
  Vec3 local_88 [2];
  float local_70;
  float local_60;
  undefined8 local_58;
  float local_50;
  undefined8 local_48;
  float local_40;
  Vec3 local_38;
  long *local_28;
  int local_1c;
  Vec3 local_c;
  
  fVar3 = 0.0;
  OpenSteer::Vec3::Vec3(&local_c,0.0,0.0,0.0);
  VVar4.z = fVar3;
  VVar4.x = (float)(int)extraout_XMM0_Qa;
  VVar4.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  local_1c = 0;
  while( true ) {
    fVar3 = VVar4.z;
    if (3 < local_1c) break;
    local_28 = *(long **)((anonymous_namespace)::ctfEnemies + (long)local_1c * 8);
    local_58 = (**(code **)(*local_28 + 0x40))();
    local_50 = fVar3;
    local_48 = local_58;
    local_40 = fVar3;
    (*(in_RDI->super_LocalSpaceMixin<OpenSteer::AbstractVehicle>).super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])();
    local_70 = fVar3;
    local_60 = fVar3;
    VVar4 = OpenSteer::Vec3::operator-((Vec3 *)in_RDI,in_stack_fffffffffffffe88);
    local_88[0].z = VVar4.z;
    local_38.z = local_88[0].z;
    local_88[0]._0_8_ = VVar4._0_8_;
    local_38.x = local_88[0].x;
    local_38.y = local_88[0].y;
    in_stack_fffffffffffffe88 = &local_38;
    local_88[0] = VVar4;
    local_8c = OpenSteer::Vec3::length((Vec3 *)0x12efec);
    fVar3 = local_8c * 0.5;
    fVar2 = (float)(**(code **)(*local_28 + 0xd8))();
    local_90 = fVar3 / fVar2;
    local_a0._0_8_ = (**(code **)(*local_28 + 0xe8))(local_90);
    local_a0.z = fVar2;
    (**(code **)(*local_28 + 0xc0))();
    OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
    annotationXZCircle(in_RDI,(float)((ulong)in_stack_fffffffffffffe88 >> 0x20),&local_a0,
                       (Color *)CONCAT44(fVar3,in_stack_fffffffffffffe78),0);
    VVar4 = OpenSteer::
            SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
            ::xxxsteerForFlee(in_stack_ffffffffffffff20,
                              (Vec3 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
    ;
    in_stack_ffffffffffffff18 = VVar4.z;
    (*(in_RDI->super_LocalSpaceMixin<OpenSteer::AbstractVehicle>).super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[6])();
    in_stack_ffffffffffffff20 = extraout_XMM0_Qa_00;
    OpenSteer::Vec3::dot((Vec3 *)&stack0xffffffffffffff20,in_stack_fffffffffffffe88);
    (*(in_RDI->super_LocalSpaceMixin<OpenSteer::AbstractVehicle>).super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[0x18])();
    OpenSteer::Vec3::operator*((Vec3 *)in_RDI,(float)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    OpenSteer::Vec3::operator*((Vec3 *)in_RDI,(float)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    VVar4 = OpenSteer::Vec3::operator+=
                      ((Vec3 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (Vec3 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    in_stack_fffffffffffffebc = VVar4.x;
    in_stack_fffffffffffffec0 = VVar4.y;
    local_150 = VVar4.z;
    local_1c = local_1c + 1;
    in_stack_fffffffffffffec4 = local_150;
  }
  VVar1.z = local_c.z;
  VVar1.x = local_c.x;
  VVar1.y = local_c.y;
  return VVar1;
}

Assistant:

Vec3 CtfSeeker::XXXsteerToEvadeAllDefenders (void)
    {
        // sum up weighted evasion
        Vec3 evade (0, 0, 0);
        for (int i = 0; i < ctfEnemyCount; i++)
        {
            const CtfEnemy& e = *ctfEnemies[i];
            const Vec3 eOffset = e.position() - position();
            const float eDistance = eOffset.length();

            // xxx maybe this should take into account e's heading? xxx
            const float timeEstimate = 0.5f * eDistance / e.speed(); //xxx
            const Vec3 eFuture = e.predictFuturePosition (timeEstimate);

            // annotation
            annotationXZCircle (e.radius(), eFuture, evadeColor, 20);

            // steering to flee from eFuture (enemy's future position)
            const Vec3 flee = xxxsteerForFlee (eFuture);

            const float eForwardDistance = forward().dot (eOffset);
            const float behindThreshold = radius() * -2;

            const float distanceWeight = 4 / eDistance;
            const float forwardWeight = ((eForwardDistance > behindThreshold) ?
                                         1.0f : 0.5f);

            const Vec3 adjustedFlee = flee * distanceWeight * forwardWeight;

            evade += adjustedFlee;
        }
        return evade;
    }